

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi_load_from_memory(stbi_uc *buffer,int len,int *x,int *y,int *comp,int req_comp)

{
  uchar *puVar1;
  stbi__context s;
  stbi__context local_e0;
  
  local_e0.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  local_e0.read_from_callbacks = 0;
  local_e0.callback_already_read = 0;
  local_e0.img_buffer_end = buffer + len;
  local_e0.img_buffer = buffer;
  local_e0.img_buffer_original = buffer;
  local_e0.img_buffer_original_end = local_e0.img_buffer_end;
  puVar1 = stbi__load_and_postprocess_8bit(&local_e0,x,y,comp,req_comp);
  return puVar1;
}

Assistant:

STBIDEF stbi_uc *stbi_load_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *comp, int req_comp)
{
   stbi__context s;
   stbi__start_mem(&s,buffer,len);
   return stbi__load_and_postprocess_8bit(&s,x,y,comp,req_comp);
}